

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildTestDyndepBuildDiscoverNowWantEdge::Run(BuildTestDyndepBuildDiscoverNowWantEdge *this)

{
  VirtualFileSystem *this_00;
  Builder *this_01;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  string err;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule touch\n  command = touch $out $out.imp\nrule cp\n  command = cp $in $out\nbuild dd: cp dd-in\nbuild tmp: touch || dd\n  dyndep = dd\nbuild out: touch tmp || dd\n  dyndep = dd\n"
              ,(ManifestParserOptions)0x0);
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"tmp",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_69);
  this_00 = &(this->super_BuildTest).fs_;
  VirtualFileSystem::Create(this_00,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"out",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_69);
  VirtualFileSystem::Create(this_00,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd-in",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "ninja_dyndep_version = 1\nbuild out: dyndep\nbuild tmp | tmp.imp: dyndep\n",&local_69)
  ;
  VirtualFileSystem::Create(this_00,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  pTVar2 = g_current_test;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out",&local_6a);
  this_01 = &(this->super_BuildTest).builder_;
  pNVar4 = Builder::AddTarget(this_01,&local_48,&local_68);
  testing::Test::Check
            (pTVar2,pNVar4 != (Node *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
             ,0xb8f,"builder_.AddTarget(\"out\", &err)");
  std::__cxx11::string::~string((string *)&local_48);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&local_68);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0xb90,"\"\" == err");
  pTVar2 = g_current_test;
  if (bVar3) {
    bVar3 = Builder::Build(this_01,&local_68);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0xb91,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_68);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0xb92,"\"\" == err");
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_BuildTest).command_runner_.commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_BuildTest).command_runner_.commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0xb93,"3u == command_runner_.commands_ran_.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      bVar3 = std::operator==("cp dd-in dd",
                              (this->super_BuildTest).command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xb94,"\"cp dd-in dd\" == command_runner_.commands_ran_[0]");
      pTVar2 = g_current_test;
      bVar3 = std::operator==("touch tmp tmp.imp",
                              (this->super_BuildTest).command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xb95,"\"touch tmp tmp.imp\" == command_runner_.commands_ran_[1]");
      pTVar2 = g_current_test;
      bVar3 = std::operator==("touch out out.imp",
                              (this->super_BuildTest).command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xb96,"\"touch out out.imp\" == command_runner_.commands_ran_[2]");
      goto LAB_00130ef8;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00130ef8:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuildDiscoverNowWantEdge) {
  // Verify that a dyndep file can be built and loaded to discover
  // that an edge is actually wanted due to a missing implicit output.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out $out.imp\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build tmp: touch || dd\n"
"  dyndep = dd\n"
"build out: touch tmp || dd\n"
"  dyndep = dd\n"
));
  fs_.Create("tmp", "");
  fs_.Create("out", "");
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"build tmp | tmp.imp: dyndep\n"
);

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cp dd-in dd", command_runner_.commands_ran_[0]);
  EXPECT_EQ("touch tmp tmp.imp", command_runner_.commands_ran_[1]);
  EXPECT_EQ("touch out out.imp", command_runner_.commands_ran_[2]);
}